

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcomparehelpers.h
# Opt level: O1

int __thiscall QCollatorSortKey::compare(QCollatorSortKey *this,QCollatorSortKey *otherKey)

{
  int iVar1;
  char *str2;
  char *str1;
  
  str1 = (((this->d).d.ptr)->m_key).d.ptr;
  if (str1 == (char *)0x0) {
    str1 = "";
  }
  str2 = (((otherKey->d).d.ptr)->m_key).d.ptr;
  if (str2 == (char *)0x0) {
    str2 = "";
  }
  iVar1 = qstrcmp(str1,str2);
  return iVar1;
}

Assistant:

constexpr P get() const noexcept { return ptr; }